

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O2

bool icu_63::anon_unknown_1::equalStrings(UnicodeString *s1,UnicodeString *s2)

{
  UBool UVar1;
  bool bVar2;
  
  bVar2 = s1 == (UnicodeString *)0x0 && s2 == (UnicodeString *)0x0;
  if (s2 != (UnicodeString *)0x0 && s1 != (UnicodeString *)0x0) {
    UVar1 = UnicodeString::operator==(s1,s2);
    bVar2 = UVar1 != '\0';
  }
  return bVar2;
}

Assistant:

bool equalStrings(const UnicodeString *s1, const UnicodeString *s2) {
    if(s1 == nullptr) {
        return s2 == nullptr;
    } else if(s2 == nullptr) {
        return false;
    } else {
        return *s1 == *s2;
    }
}